

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  float fVar4;
  float *pfVar5;
  uint *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float lhs;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  uint in_stack_00000010;
  ImVec2 *in_stack_00000018;
  float grab_pos;
  float grab_t;
  uint v_new_1;
  float new_clicked_t;
  uint v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  int v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_logarithmic;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  int local_e8;
  float local_e4;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  float x1;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 uVar15;
  undefined1 uVar16;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  ImGuiInputReadMode in_stack_ffffffffffffff58;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff5c;
  ImVec2 local_a0;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float local_78;
  float local_74;
  float fStack_70;
  float zero_deadzone_halfsize_00;
  uint in_stack_ffffffffffffff9c;
  float logarithmic_zero_epsilon_00;
  undefined1 uVar17;
  byte bVar18;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 is_logarithmic_00;
  float fVar19;
  float local_44;
  
  pIVar2 = GImGui;
  is_logarithmic_00 = (undefined1)((uint)in_stack_ffffffffffffffa0 >> 0x18);
  uVar3 = (uint)((in_stack_00000010 & 0x100000) != 0);
  bVar6 = in_EDX == 8;
  bVar7 = in_EDX == 9;
  uVar16 = bVar6 || bVar7;
  bVar8 = (in_stack_00000010 & 0x20) != 0;
  uVar15 = bVar8 && (bool)uVar16;
  fVar9 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar10 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar10 = (fVar9 - fVar10) - 4.0;
  local_44 = (pIVar2->Style).GrabMinSize;
  if (in_R8D < in_R9D) {
    fVar4 = (float)(in_R9D - in_R8D);
  }
  else {
    fVar4 = (float)(in_R8D - in_R9D);
  }
  x1 = fVar4;
  if ((!bVar6 && !bVar7) && (-1 < (int)fVar4)) {
    local_44 = ImMax<float>(fVar10 / (float)((int)fVar4 + 1),(pIVar2->Style).GrabMinSize);
  }
  fVar11 = ImMin<float>(local_44,fVar10);
  lhs = fVar10 - fVar11;
  fVar12 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar12 = fVar11 * 0.5 + fVar12 + 2.0;
  fVar13 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar11 = -fVar11 * 0.5 + (fVar13 - 2.0);
  fVar13 = 0.0;
  fVar19 = 0.0;
  if (bVar8 && (bVar6 || bVar7)) {
    if (bVar6 || bVar7) {
      in_stack_ffffffffffffff28 =
           (float)ImParseFormatPrecision
                            ((char *)CONCAT44(x1,in_stack_ffffffffffffff28),
                             (int)in_stack_ffffffffffffff24);
    }
    else {
      in_stack_ffffffffffffff28 = 1.4013e-45;
    }
    fVar19 = in_stack_ffffffffffffff28;
    fVar13 = ImPow(0.0,2.50122e-39);
    is_logarithmic_00 = (undefined1)((uint)fVar19 >> 0x18);
    in_stack_ffffffffffffff24 = (pIVar2->Style).LogSliderDeadzone * 0.5;
    fVar19 = ImMax<float>(lhs,1.0);
    fVar19 = in_stack_ffffffffffffff24 / fVar19;
  }
  bVar18 = 0;
  if (pIVar2->ActiveId == in_ESI) {
    logarithmic_zero_epsilon_00 = (float)(in_stack_ffffffffffffff9c & 0xffff);
    zero_deadzone_halfsize_00 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar2->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar5 = ImVec2::operator[](&(pIVar2->IO).MousePos,(long)(int)uVar3);
        if (lhs <= 0.0) {
          in_stack_ffffffffffffff20 = 0.0;
        }
        else {
          in_stack_ffffffffffffff20 = ImClamp<float>((*pfVar5 - fVar12) / lhs,0.0,1.0);
        }
        zero_deadzone_halfsize_00 = in_stack_ffffffffffffff20;
        if (uVar3 == 1) {
          zero_deadzone_halfsize_00 = 1.0 - in_stack_ffffffffffffff20;
        }
        logarithmic_zero_epsilon_00 =
             (float)CONCAT13((char)((uint)logarithmic_zero_epsilon_00 >> 0x18),
                             CONCAT12(1,SUB42(logarithmic_zero_epsilon_00,0)));
      }
    }
    else if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar2->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar2->SliderCurrentAccum = 0.0;
        pIVar2->SliderCurrentAccumDirty = false;
      }
      IVar14 = GetNavInputAmount2d(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                                   in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      if (uVar3 == 0) {
        local_74 = IVar14.x;
        local_e4 = local_74;
      }
      else {
        fStack_70 = IVar14.y;
        local_e4 = -fStack_70;
      }
      if ((local_e4 != 0.0) || (NAN(local_e4))) {
        if (bVar6 || bVar7) {
          local_e8 = ImParseFormatPrecision
                               ((char *)CONCAT44(x1,in_stack_ffffffffffffff28),
                                (int)in_stack_ffffffffffffff24);
        }
        else {
          local_e8 = 0;
        }
        if (local_e8 < 1) {
          if (((-100.0 <= (float)(int)fVar4) && ((float)(int)fVar4 <= 100.0)) ||
             (bVar6 = IsNavInputDown(0xe), bVar6)) {
            local_78 = (float)(~-(uint)(local_e4 < 0.0) & 0x3f800000 |
                              -(uint)(local_e4 < 0.0) & 0xbf800000) / (float)(int)fVar4;
          }
          else {
            local_78 = local_e4 / 100.0;
          }
        }
        else {
          local_78 = local_e4 / 100.0;
          bVar6 = IsNavInputDown(0xe);
          if (bVar6) {
            local_78 = local_78 / 10.0;
          }
        }
        bVar6 = IsNavInputDown(0xf);
        if (bVar6) {
          local_78 = local_78 * 10.0;
        }
        pIVar2->SliderCurrentAccum = local_78 + pIVar2->SliderCurrentAccum;
        pIVar2->SliderCurrentAccumDirty = true;
      }
      in_stack_ffffffffffffff80 = pIVar2->SliderCurrentAccum;
      if ((pIVar2->NavActivatePressedId == in_ESI) && ((pIVar2->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar2->SliderCurrentAccumDirty & 1U) != 0) {
        zero_deadzone_halfsize_00 =
             ScaleRatioFromValueT<unsigned_int,int,float>
                       ((ImGuiDataType)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78,(uint)in_stack_ffffffffffffff74,
                        SUB41(in_stack_ffffffffffffff70 >> 0x18,0),in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff68);
        uVar17 = (undefined1)((uint)logarithmic_zero_epsilon_00 >> 0x18);
        if (((1.0 <= zero_deadzone_halfsize_00) && (0.0 < in_stack_ffffffffffffff80)) ||
           ((zero_deadzone_halfsize_00 <= 0.0 && (in_stack_ffffffffffffff80 < 0.0)))) {
          logarithmic_zero_epsilon_00 =
               (float)CONCAT13(uVar17,(uint3)SUB42(logarithmic_zero_epsilon_00,0));
          pIVar2->SliderCurrentAccum = 0.0;
        }
        else {
          logarithmic_zero_epsilon_00 =
               (float)CONCAT13(uVar17,CONCAT12(1,SUB42(logarithmic_zero_epsilon_00,0)));
          fVar4 = ImSaturate(zero_deadzone_halfsize_00 + in_stack_ffffffffffffff80);
          in_stack_ffffffffffffff78 =
               ScaleValueFromRatioT<unsigned_int,int,float>
                         ((ImGuiDataType)fVar12,fVar11,(uint)fVar13,(uint)fVar19,
                          (bool)is_logarithmic_00,logarithmic_zero_epsilon_00,fVar4);
          in_stack_ffffffffffffff7c = zero_deadzone_halfsize_00;
          if ((in_stack_00000010 & 0x40) == 0) {
            in_stack_ffffffffffffff78 =
                 RoundScalarWithFormatT<unsigned_int,int>
                           ((char *)CONCAT44(zero_deadzone_halfsize_00,in_stack_ffffffffffffff78),
                            (ImGuiDataType)in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
            in_stack_ffffffffffffff7c = zero_deadzone_halfsize_00;
          }
          zero_deadzone_halfsize_00 = fVar4;
          in_stack_ffffffffffffff74 =
               ScaleRatioFromValueT<unsigned_int,int,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78,(uint)in_stack_ffffffffffffff74,
                          SUB41(in_stack_ffffffffffffff70 >> 0x18,0),in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68);
          if (in_stack_ffffffffffffff80 <= 0.0) {
            fVar4 = ImMax<float>(in_stack_ffffffffffffff74 - in_stack_ffffffffffffff7c,
                                 in_stack_ffffffffffffff80);
            pIVar2->SliderCurrentAccum = pIVar2->SliderCurrentAccum - fVar4;
          }
          else {
            fVar4 = ImMin<float>(in_stack_ffffffffffffff74 - in_stack_ffffffffffffff7c,
                                 in_stack_ffffffffffffff80);
            pIVar2->SliderCurrentAccum = pIVar2->SliderCurrentAccum - fVar4;
          }
        }
        pIVar2->SliderCurrentAccumDirty = false;
      }
    }
    if (((uint)logarithmic_zero_epsilon_00 & 0x10000) != 0) {
      in_stack_ffffffffffffff70 =
           ScaleValueFromRatioT<unsigned_int,int,float>
                     ((ImGuiDataType)fVar12,fVar11,(uint)fVar13,(uint)fVar19,(bool)is_logarithmic_00
                      ,logarithmic_zero_epsilon_00,zero_deadzone_halfsize_00);
      if ((in_stack_00000010 & 0x40) == 0) {
        in_stack_ffffffffffffff70 =
             RoundScalarWithFormatT<unsigned_int,int>
                       ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (ImGuiDataType)in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
      }
      if (*in_RCX != in_stack_ffffffffffffff70) {
        *in_RCX = in_stack_ffffffffffffff70;
        logarithmic_zero_epsilon_00 = 2.3509887e-38;
      }
    }
    bVar18 = (byte)((uint)logarithmic_zero_epsilon_00 >> 0x18);
  }
  if (1.0 <= fVar10) {
    fVar10 = ScaleRatioFromValueT<unsigned_int,int,float>
                       ((ImGuiDataType)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78,(uint)in_stack_ffffffffffffff74,
                        SUB41(in_stack_ffffffffffffff70 >> 0x18,0),in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff68);
    if (uVar3 == 1) {
      fVar10 = 1.0 - fVar10;
    }
    ImLerp<float>(fVar12,fVar11,fVar10);
    if (uVar3 == 0) {
      ImRect::ImRect((ImRect *)
                     CONCAT17(uVar16,CONCAT16(uVar15,CONCAT24(in_stack_ffffffffffffff34,fVar9))),x1,
                     in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
      *in_stack_00000018 = local_b8;
      IVar14.y = in_stack_ffffffffffffff54;
      IVar14.x = in_stack_ffffffffffffff50;
      in_stack_00000018[1] = IVar14;
    }
    else {
      ImRect::ImRect((ImRect *)
                     CONCAT17(uVar16,CONCAT16(uVar15,CONCAT24(in_stack_ffffffffffffff34,fVar9))),x1,
                     in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
      *in_stack_00000018 = local_c8;
      in_stack_00000018[1] = local_c0;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&local_a0,in_RDI,in_RDI);
    *in_stack_00000018 = local_a0;
    IVar1.y = in_stack_ffffffffffffff6c;
    IVar1.x = in_stack_ffffffffffffff68;
    in_stack_00000018[1] = IVar1;
  }
  return (bool)(bVar18 & 1);
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}